

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

int __thiscall
CVmObjFile::getp_unpackBytes(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  ushort uVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  int iVar4;
  ushort *puVar5;
  long lVar6;
  
  if (oargc == (uint *)0x0) {
    lVar6 = 1;
  }
  else {
    lVar6 = (long)(int)(*oargc + 1);
  }
  if (getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar4 = __cxa_guard_acquire(&getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar4 != 0) {
      getp_unpackBytes::desc.min_argc_ = 1;
      getp_unpackBytes::desc.opt_argc_ = 0;
      getp_unpackBytes::desc.varargs_ = 0;
      __cxa_guard_release(&getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_unpackBytes::desc);
  if (iVar4 == 0) {
    check_raw_read(this);
    puVar5 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    pvVar3 = sp_;
    if (puVar5 == (ushort *)0x0) {
      err_throw(0x900);
    }
    uVar1 = *puVar5;
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar3->val).obj = self;
    CVmPack::unpack(retval,(char *)(puVar5 + 1),(ulong)uVar1,
                    *(CVmDataSource **)((this->super_CVmObject).ext_ + 8));
    sp_ = sp_ + -lVar6;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_unpackBytes(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check that the it's a valid file open with read access in "raw" mode */
    check_raw_read(vmg0_);

    /* get the format string, but leave it on the stack */
    const char *fmt = G_stk->get(0)->get_as_string(vmg0_);
    if (fmt == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the format string pointer and length */
    size_t fmtlen = vmb_get_len(fmt);
    fmt += VMB_LEN;

    /* save 'self' for gc protection */
    G_stk->push_obj(vmg_ self);

    /* unpack the data from our file stream into a list, returning the list */
    CVmPack::unpack(vmg_ retval, fmt, fmtlen, get_ext()->fp);

    /* discard our arguments and gc protection */
    G_stk->discard(argc + 1);
        
    /* handled */
    return TRUE;
}